

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

size_t __thiscall
Potassco::ProgramOptions::OptionContext::findGroupKey(OptionContext *this,string *name)

{
  __type _Var1;
  size_type sVar2;
  const_reference this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t i;
  size_type local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  
  local_20 = 0;
  __lhs = in_RDI;
  while( true ) {
    sVar2 = std::
            vector<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
            ::size((vector<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
                    *)&in_RDI[2]._M_string_length);
    if (local_20 == sVar2) {
      return 0xffffffffffffffff;
    }
    this_00 = std::
              vector<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
              ::operator[]((vector<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
                            *)&in_RDI[2]._M_string_length,local_20);
    OptionGroup::caption_abi_cxx11_(this_00);
    _Var1 = std::operator==(__lhs,in_RSI);
    if (_Var1) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

size_t OptionContext::findGroupKey(const std::string& name) const {
	for (size_t i = 0; i != groups_.size(); ++i) {
		if (groups_[i].caption() == name) { return i; }
	}
	return size_t(-1);
}